

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

void wasm::Literal::printFloat(ostream *o,float f)

{
  ostream *poVar1;
  char *pcVar2;
  
  if (!NAN(f)) {
    printDouble(o,(double)f);
    return;
  }
  pcVar2 = "";
  if ((int)f < 0) {
    pcVar2 = "-";
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar2,(ulong)((uint)f >> 0x1f));
  std::__ostream_insert<char,std::char_traits<char>>(o,"nan",3);
  if (((uint)f & 0x7fffff) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(o,":0x",3);
    *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) =
         *(uint *)(o + *(long *)(*(long *)o + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)o);
    *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
         *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  }
  return;
}

Assistant:

void Literal::printFloat(std::ostream& o, float f) {
  if (std::isnan(f)) {
    const char* sign = std::signbit(f) ? "-" : "";
    o << sign << "nan";
    if (uint32_t payload = NaNPayload(f)) {
      o << ":0x" << std::hex << payload << std::dec;
    }
    return;
  }
  printDouble(o, f);
}